

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_247fc0::QPDFPageData::QPDFPageData
          (QPDFPageData *this,string *filename,QPDF *qpdf,string *range)

{
  int max;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__x;
  char *range_00;
  runtime_error *e;
  vector<int,_std::allocator<int>_> local_50;
  string *local_28;
  string *range_local;
  QPDF *qpdf_local;
  string *filename_local;
  QPDFPageData *this_local;
  
  local_28 = range;
  range_local = (string *)qpdf;
  qpdf_local = (QPDF *)filename;
  filename_local = &this->filename;
  std::__cxx11::string::string((string *)this,(string *)filename);
  this->qpdf = (QPDF *)range_local;
  __x = QPDF::getAllPages((QPDF *)range_local);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&this->orig_pages,__x);
  std::vector<int,_std::allocator<int>_>::vector(&this->selected_pages);
  range_00 = (char *)std::__cxx11::string::c_str();
  e = (runtime_error *)
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(&this->orig_pages);
  max = QIntC::to_int<unsigned_long>((unsigned_long *)&e);
  QUtil::parse_numrange(&local_50,range_00,max);
  std::vector<int,_std::allocator<int>_>::operator=(&this->selected_pages,&local_50);
  std::vector<int,_std::allocator<int>_>::~vector(&local_50);
  return;
}

Assistant:

QPDFPageData::QPDFPageData(std::string const& filename, QPDF* qpdf, std::string const& range) :
    filename(filename),
    qpdf(qpdf),
    orig_pages(qpdf->getAllPages())
{
    try {
        this->selected_pages =
            QUtil::parse_numrange(range.c_str(), QIntC::to_int(this->orig_pages.size()));
    } catch (std::runtime_error& e) {
        throw std::runtime_error("parsing numeric range for " + filename + ": " + e.what());
    }
}